

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O1

Var Js::WebAssemblyInstance::GetterExports(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  WebAssemblyInstance *pWVar6;
  RecyclableObject *aValue;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyInstance.cpp"
                                ,0x54,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d9ac81;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_30 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyInstance.cpp"
                                ,0x57,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d9ac81;
    *puVar4 = 0;
  }
  if (((ulong)local_30 & 0xffffff) == 0) {
LAB_00d9ac72:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e48f,(PCWSTR)0x0);
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_30,0);
  bVar3 = VarIs<Js::WebAssemblyInstance>(pvVar5);
  if (!bVar3) goto LAB_00d9ac72;
  pvVar5 = Arguments::operator[]((Arguments *)local_30,0);
  pWVar6 = VarTo<Js::WebAssemblyInstance>(pvVar5);
  aValue = (RecyclableObject *)(pWVar6->m_exports).ptr;
  if (aValue != (RecyclableObject *)0x0) {
    bVar3 = DynamicObject::IsBaseDynamicObject(aValue);
    if (bVar3) goto LAB_00d9ac5c;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyInstance.cpp"
                              ,0x62,"((0))","UNREACHED");
  if (!bVar3) {
LAB_00d9ac81:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
  aValue = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
LAB_00d9ac5c:
  pvVar5 = CrossSite::MarshalVar(pSVar1,aValue,false);
  return pvVar5;
}

Assistant:

Var
WebAssemblyInstance::GetterExports(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyInstance>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedInstanceObject);
    }

    WebAssemblyInstance* instance = VarTo<WebAssemblyInstance>(args[0]);
    Js::Var exports = instance->m_exports;
    if (!exports || !DynamicObject::IsBaseDynamicObject(exports))
    {
        Assert(UNREACHED);
        exports = scriptContext->GetLibrary()->GetUndefined();
    }
    return CrossSite::MarshalVar(scriptContext, exports);
}